

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O1

void __thiscall llvm::DWARFUnit::clearDIEs(DWARFUnit *this,bool KeepCUDie)

{
  ulong uVar1;
  undefined7 in_register_00000031;
  ulong __new_size;
  
  uVar1 = ((long)(this->DieArray).
                 super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->DieArray).
                 super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  __new_size = CONCAT71(in_register_00000031,KeepCUDie) & 0xffffffff;
  if (__new_size <= uVar1 && uVar1 - __new_size != 0) {
    std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>::resize
              (&this->DieArray,__new_size);
    if ((this->DieArray).
        super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage !=
        (this->DieArray).
        super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      std::
      __shrink_to_fit_aux<std::vector<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>,_true>
      ::_S_do_it(&this->DieArray);
      return;
    }
  }
  return;
}

Assistant:

void DWARFUnit::clearDIEs(bool KeepCUDie) {
  if (DieArray.size() > (unsigned)KeepCUDie) {
    DieArray.resize((unsigned)KeepCUDie);
    DieArray.shrink_to_fit();
  }
}